

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  char (*in_R9) [2];
  string local_70;
  string local_50;
  byte local_29;
  char *pcStack_28;
  bool forward;
  char *op_local;
  uint32_t local_18;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pcStack_28 = op;
  op_local._4_4_ = op0;
  local_18 = result_id;
  op0_local = result_type;
  _result_id_local = this;
  local_29 = should_forward(this,op0);
  result_type_00 = op0_local;
  result_id_00 = local_18;
  to_unpacked_expression_abi_cxx11_(&local_70,this,op_local._4_4_,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            (&local_50,(spirv_cross *)&stack0xffffffffffffffd8,(char **)0x4a488c,
             (char (*) [2])&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,in_R9);
  emit_op(this,result_type_00,result_id_00,&local_50,(bool)(local_29 & 1),false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,local_18,op_local._4_4_);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op)
{
	bool forward = should_forward(op0);
	emit_op(result_type, result_id, join(op, "(", to_unpacked_expression(op0), ")"), forward);
	inherit_expression_dependencies(result_id, op0);
}